

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

int __thiscall
section_data::slice_horiz_horiz(section_data *this,int *line_start,int *line_end,int *layer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  intercept_data intercept;
  intercept_data intercept_00;
  intercept_data intercept_01;
  intercept_data intercept_02;
  intercept_data intercept_03;
  intercept_data intercept_04;
  intercept_data intercept_05;
  intercept_data intercept_06;
  
  if (line_start[1] == this->y1) {
    iVar1 = *line_start;
    iVar2 = *line_end;
    iVar3 = this->x1;
    iVar4 = this->x2;
    if (iVar3 < iVar2 || iVar1 <= iVar4) {
      if (iVar1 == iVar3) {
        intercept.y = line_start[1];
        intercept.x = iVar1;
        intercept.dist = 0;
        push_intercept(this,layer,intercept);
        iVar3 = this->x1;
        iVar4 = this->x2;
      }
      if (iVar1 == iVar4) {
        intercept_00.y = this->y2;
        intercept_00.x = iVar1;
        intercept_00.dist = iVar1 - iVar3;
        push_intercept(this,layer,intercept_00);
        iVar3 = this->x1;
      }
      if (iVar2 == iVar3) {
        intercept_01.y = this->y1;
        intercept_01.x = iVar2;
        intercept_01.dist = 0;
        push_intercept(this,layer,intercept_01);
        iVar3 = this->x1;
      }
      iVar4 = this->x2;
      if (iVar2 == iVar4) {
        intercept_02.y = this->y2;
        intercept_02.x = iVar2;
        intercept_02.dist = iVar2 - iVar3;
        push_intercept(this,layer,intercept_02);
        iVar3 = this->x1;
        iVar4 = this->x2;
      }
      if (iVar1 < iVar4 && iVar3 < iVar1) {
        intercept_03.y = this->y2;
        intercept_03.x = iVar1;
        intercept_03.dist = iVar1 - iVar3;
        push_intercept(this,layer,intercept_03);
        iVar3 = this->x1;
        iVar4 = this->x2;
      }
      if ((iVar3 < iVar2) && (iVar2 < iVar4)) {
        intercept_04.y = this->y2;
        intercept_04.x = iVar2;
        intercept_04.dist = iVar2 - iVar3;
        push_intercept(this,layer,intercept_04);
        iVar3 = this->x1;
      }
      if (iVar3 < iVar2 && iVar1 < iVar3) {
        intercept_05.y = this->y2;
        intercept_05.x = iVar3;
        intercept_05.dist = 0;
        push_intercept(this,layer,intercept_05);
      }
      iVar4 = this->x2;
      if (iVar4 < iVar2 && iVar1 < iVar4) {
        intercept_06.y = this->y2;
        intercept_06.x = iVar4;
        intercept_06.dist = iVar4 - this->x1;
        push_intercept(this,layer,intercept_06);
      }
    }
  }
  return 0;
}

Assistant:

int section_data::slice_horiz_horiz(int line_start[2], int line_end[2],
                                    int &layer)
{
  int xa = line_start[0];
  int xb = line_end[0];
  intercept_data tempy;
  if (line_start[1] == y1) // Lines could interact only if on same height
  {
    if ((xa <= x2) || (x1 < xb)) // Lines have some interaction
    {
      if (xa == x1) {
        tempy.x = x1;
        tempy.y = y1;
        tempy.dist = 0;
        push_intercept(layer, tempy);
      }
      if (xa == x2) {
        tempy.x = x2;
        tempy.y = y2;
        tempy.dist = x2 - x1;
        push_intercept(layer, tempy);
      }
      if (xb == x1) {
        tempy.x = x1;
        tempy.y = y1;
        tempy.dist = 0;
        push_intercept(layer, tempy);
      }
      if (xb == x2) {
        tempy.x = x2;
        tempy.y = y2;
        tempy.dist = x2 - x1;
        push_intercept(layer, tempy);
      }
      if ((xa > x1) && (xa < x2)) {
        tempy.x = xa;
        tempy.y = y2;
        tempy.dist = xa - x1;
        push_intercept(layer, tempy);
      }
      if ((xb > x1) && (xb < x2)) {
        tempy.x = xb;
        tempy.y = y2;
        tempy.dist = xb - x1;
        push_intercept(layer, tempy);
      }
      if ((x1 > xa) && (x1 < xb)) {
        tempy.x = x1;
        tempy.y = y2;
        tempy.dist = 0;
        push_intercept(layer, tempy);
      }
      if ((x2 > xa) && (x2 < xb)) {
        tempy.x = x2;
        tempy.y = y2;
        tempy.dist = x2 - x1;
        push_intercept(layer, tempy);
      }
    }
  }
  return EXIT_SUCCESS;
}